

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

void __thiscall
tsl::detail_robin_hash::
bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
::swap_with_value_in_bucket
          (bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
           *this,distance_type *dist_from_ideal_bucket,truncated_hash_type *hash,value_type *value)

{
  truncated_hash_type tVar1;
  value_type *__y;
  truncated_hash_type tmp_hash;
  value_type *value_local;
  truncated_hash_type *hash_local;
  distance_type *dist_from_ideal_bucket_local;
  bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
  *this_local;
  
  __y = bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
        ::value(this);
  std::swap<std::__cxx11::wstring,unsigned_int>(value,__y);
  std::swap<short>(dist_from_ideal_bucket,&this->m_dist_from_ideal_bucket);
  tVar1 = bucket_entry_hash<true>::truncated_hash(&this->super_bucket_entry_hash<true>);
  bucket_entry_hash<true>::set_hash(&this->super_bucket_entry_hash<true>,*hash);
  *hash = tVar1;
  return;
}

Assistant:

void swap_with_value_in_bucket(distance_type& dist_from_ideal_bucket, 
                                   truncated_hash_type& hash, value_type& value) 
    {
        tsl_assert(!empty());
        
        using std::swap;
        swap(value, this->value());
        swap(dist_from_ideal_bucket, m_dist_from_ideal_bucket);
        
        // Avoid warning of unused variable if StoreHash is false
        (void) hash;
        if(StoreHash) {
            const truncated_hash_type tmp_hash = this->truncated_hash();
            this->set_hash(hash);
            hash = tmp_hash;
        }
    }